

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer puVar1;
  CallBase *this;
  Value *val;
  PSNode *pPVar2;
  Offset OVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  Function *pFVar7;
  PSNode *pPVar8;
  PSNode *pPVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  Pointer *ptr;
  pointer puVar16;
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  StringRef RHS_02;
  StringRef RHS_03;
  StringRef RHS_04;
  StringRef RHS_05;
  StringRef RHS_06;
  StringRef RHS_07;
  StringRef RHS_08;
  StringRef RHS_09;
  StringRef SVar17;
  Pointer PVar18;
  PointsToSetT *__range2;
  Offset local_430;
  Pointer local_428;
  const_iterator __begin1;
  PointsToSetT *__range2_1;
  Pointer local_3f0;
  StringRef local_3e0;
  PSNode *local_3d0;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  undefined1 local_3b8 [24];
  DGLLVMPointerAnalysis PTA;
  LLVMPointerAnalysisOptions local_310;
  SlicerOptions options;
  
  setupStackTraceOnError(argc,argv);
  iVar13 = 1;
  parseSlicerOptions((int)&options,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext(&context);
  parseModule((char *)&M,(LLVMContext *)"llvm-pta-ben",(SlicerOptions *)&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) {
    dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
              (&local_310,(LLVMPointerAnalysisOptions *)&options);
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              (&PTA,(Module *)
                    M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                    _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                    super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&local_310);
    dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions(&local_310);
    local_3b8._0_8_ = std::chrono::_V2::steady_clock::now();
    dg::DGLLVMPointerAnalysis::run(&PTA);
    local_3b8._8_8_ = std::chrono::_V2::steady_clock::now();
    std::__cxx11::string::string
              ((string *)&__begin1,"INFO: Pointer analysis took",(allocator *)&local_428);
    dg::debug::TimeMeasure::report
              ((TimeMeasure *)local_3b8,(string *)&__begin1,(ostream *)&std::cerr);
    std::__cxx11::string::_M_dispose();
    OVar3.offset = dg::Offset::UNKNOWN.offset;
    puVar16 = ((PTA.PS)->nodes).
              super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = ((PTA.PS)->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (puVar16 == puVar1) break;
      pPVar8 = (puVar16->_M_t).
               super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl;
      if ((((pPVar8 != (PSNode *)0x0) && (*(int *)(pPVar8 + 0x90) == 8)) &&
          (this = *(CallBase **)(pPVar8 + 0x18), this != (CallBase *)0x0)) &&
         (this[0x10] == (CallBase)0x53)) {
        pFVar7 = llvm::CallBase::getCalledFunction(this);
        if (pFVar7 != (Function *)0x0) {
          SVar17 = (StringRef)llvm::Value::getName();
          local_3e0 = SVar17;
          uVar5 = llvm::CallBase::arg_size(this);
          if (uVar5 == 2) {
            SVar17.Length = 7;
            SVar17.Data = "NOALIAS";
            bVar4 = llvm::StringRef::equals(&local_3e0,SVar17);
            if (!bVar4) {
              RHS.Length = 8;
              RHS.Data = "MAYALIAS";
              bVar4 = llvm::StringRef::equals(&local_3e0,RHS);
              if (!bVar4) {
                RHS_00.Length = 9;
                RHS_00.Data = "MUSTALIAS";
                bVar4 = llvm::StringRef::equals(&local_3e0,RHS_00);
                if (!bVar4) {
                  RHS_01.Length = 0xc;
                  RHS_01.Data = "PARTIALALIAS";
                  bVar4 = llvm::StringRef::equals(&local_3e0,RHS_01);
                  if (!bVar4) {
                    RHS_02.Length = 0x15;
                    RHS_02.Data = "EXPECTEDFAIL_MAYALIAS";
                    bVar4 = llvm::StringRef::equals(&local_3e0,RHS_02);
                    if (!bVar4) {
                      RHS_03.Length = 0x14;
                      RHS_03.Data = "EXPECTEDFAIL_NOALIAS";
                      bVar4 = llvm::StringRef::equals(&local_3e0,RHS_03);
                      if (!bVar4) goto LAB_00115ce6;
                    }
                  }
                }
              }
            }
            val = *(Value **)(this + -(ulong)(uint)(*(int *)(this + 0x14) << 5) + 0x20);
            pPVar8 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                               ((LLVMPointerGraphBuilder *)
                                PTA._builder._M_t.
                                super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                                .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>.
                                _M_head_impl,
                                *(Value **)(this + -(ulong)(uint)(*(int *)(this + 0x14) << 5)));
            pPVar9 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                               ((LLVMPointerGraphBuilder *)
                                PTA._builder._M_t.
                                super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                                .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>.
                                _M_head_impl,val);
            pPVar8 = pPVar8 + 0xb0;
            dg::ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::begin(&__begin1.container_it,
                    (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                     *)pPVar8);
            uVar5 = 0;
            while ((__begin1.container_it.pos != 0 ||
                   (__begin1.container_it.container_it.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                    _M_cur != (__node_type *)0x0))) {
              dg::pta::PointerIdPointsToSet::const_iterator::operator*
                        ((const_iterator *)&__begin1.container_it);
              uVar5 = uVar5 + 1;
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::const_iterator::operator++(&__begin1.container_it);
            }
            pPVar9 = pPVar9 + 0xb0;
            dg::ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::begin(&__begin1.container_it,
                    (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                     *)pPVar9);
            uVar14 = 0;
            while ((__begin1.container_it.pos != 0 ||
                   (__begin1.container_it.container_it.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                    _M_cur != (__node_type *)0x0))) {
              dg::pta::PointerIdPointsToSet::const_iterator::operator*
                        ((const_iterator *)&__begin1.container_it);
              uVar14 = uVar14 + 1;
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::const_iterator::operator++(&__begin1.container_it);
            }
            printf("counts = %d %d\n",(ulong)uVar5,(ulong)uVar14);
            pPVar2 = dg::pta::UNKNOWN_MEMORY;
            if (uVar14 < 2 && uVar5 < 2) {
              local_428.offset.offset = OVar3.offset;
              local_428.target = dg::pta::UNKNOWN_MEMORY;
              local_3f0.target = dg::pta::UNKNOWN_MEMORY;
              local_3f0.offset.offset = OVar3.offset;
              uVar6 = 1;
              if (uVar5 != 0 || uVar14 != 0) {
                PVar18 = local_428;
                if (uVar5 == 1) {
                  dg::ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  ::begin(&__begin1.container_it,
                          (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                           *)pPVar8);
                  PVar18 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                                     ((const_iterator *)&__begin1.container_it);
                  while ((__begin1.container_it.pos != 0 ||
                         (__begin1.container_it.container_it.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                          ._M_cur != (__node_type *)0x0))) {
                    PVar18 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                                       ((const_iterator *)&__begin1.container_it);
                    if ((PVar18.target != dg::pta::NULLPTR) &&
                       (PVar18.target != dg::pta::UNKNOWN_MEMORY)) break;
                    dg::ADT::
                    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                    ::const_iterator::operator++(&__begin1.container_it);
                  }
                }
                local_428 = PVar18;
                local_430 = local_428.offset.offset;
                PVar18.offset.offset = OVar3.offset;
                PVar18.target = pPVar2;
                pPVar8 = local_428.target;
                if (uVar14 == 1) {
                  local_3d0 = local_428.target;
                  dg::ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  ::begin(&__begin1.container_it,
                          (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                           *)pPVar9);
                  PVar18 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                                     ((const_iterator *)&__begin1.container_it);
                  while ((__begin1.container_it.pos != 0 ||
                         (__begin1.container_it.container_it.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                          ._M_cur != (__node_type *)0x0))) {
                    PVar18 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                                       ((const_iterator *)&__begin1.container_it);
                    if ((PVar18.target != dg::pta::NULLPTR) &&
                       (PVar18.target != dg::pta::UNKNOWN_MEMORY)) break;
                    dg::ADT::
                    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                    ::const_iterator::operator++(&__begin1.container_it);
                  }
                  __range2 = (PointsToSetT *)PVar18.offset.offset;
                  local_3f0.target = PVar18.target;
                  local_3f0.offset.offset = (type)__range2;
                  pPVar8 = local_3d0;
                }
                __range2 = (PointsToSetT *)PVar18.offset.offset;
                if (uVar5 == 0) {
                  ptr = &local_3f0;
                  pcVar11 = "2";
                }
                else {
                  ptr = &local_428;
                  if (uVar14 != 0) {
                    dump_pointer(ptr,"1");
                    dump_pointer(&local_3f0,"2");
                    uVar6 = 2;
                    if (((pPVar8 != dg::pta::UNKNOWN_MEMORY) &&
                        (PVar18.target != dg::pta::UNKNOWN_MEMORY)) &&
                       ((pPVar8 != PVar18.target ||
                        (((local_430.offset != OVar3.offset &&
                          (__range2 != (PointsToSetT *)OVar3.offset)) &&
                         (uVar6 = 3, (PointsToSetT *)local_430.offset != __range2)))))) {
                      uVar6 = 1;
                    }
                    goto LAB_00115bdd;
                  }
                  pcVar11 = "1";
                }
                uVar6 = check_pointer(ptr,pcVar11);
              }
            }
            else {
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::begin(&__begin1.container_it,
                      (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                       *)pPVar8);
              while ((__begin1.container_it.pos != 0 ||
                     (__begin1.container_it.container_it.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                      ._M_cur != (__node_type *)0x0))) {
                local_428 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                                      ((const_iterator *)&__begin1.container_it);
                if ((local_428.target != dg::pta::NULLPTR) &&
                   (local_428.target != dg::pta::UNKNOWN_MEMORY)) {
                  dump_pointer(&local_428,"1");
                }
                dg::ADT::
                SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                ::const_iterator::operator++(&__begin1.container_it);
              }
              dg::ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::begin(&__begin1.container_it,
                      (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                       *)pPVar9);
              while ((__begin1.container_it.pos != 0 ||
                     (__begin1.container_it.container_it.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                      ._M_cur != (__node_type *)0x0))) {
                local_428 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                                      ((const_iterator *)&__begin1.container_it);
                if ((local_428.target != dg::pta::NULLPTR) &&
                   (local_428.target != dg::pta::UNKNOWN_MEMORY)) {
                  dump_pointer(&local_428,"2");
                }
                dg::ADT::
                SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                ::const_iterator::operator++(&__begin1.container_it);
              }
              uVar6 = 2;
            }
LAB_00115bdd:
            RHS_04.Length = 7;
            RHS_04.Data = "NOALIAS";
            bVar4 = llvm::StringRef::equals(&local_3e0,RHS_04);
            if (bVar4) {
              pcVar12 = "NO";
              pcVar11 = "NO";
              pcVar15 = "true";
              if (uVar6 == 1) goto LAB_00115cd8;
              pcVar10 = "buggy";
              pcVar11 = "NO";
LAB_00115c18:
              pcVar15 = "inadequate";
LAB_00115c7d:
              if (uVar6 == 2) {
LAB_00115c83:
                pcVar12 = "MAY";
              }
              else {
LAB_00115cd1:
                pcVar15 = pcVar10;
                pcVar12 = "MUST";
              }
            }
            else {
              RHS_05.Length = 8;
              RHS_05.Data = "MAYALIAS";
              bVar4 = llvm::StringRef::equals(&local_3e0,RHS_05);
              if (!bVar4) {
                RHS_06.Length = 0xc;
                RHS_06.Data = "PARTIALALIAS";
                bVar4 = llvm::StringRef::equals(&local_3e0,RHS_06);
                if (bVar4) goto LAB_00115c4d;
                RHS_07.Length = 9;
                RHS_07.Data = "MUSTALIAS";
                bVar4 = llvm::StringRef::equals(&local_3e0,RHS_07);
                if (bVar4) {
                  if (uVar6 == 1) {
                    pcVar11 = "MUST";
                    pcVar15 = "false";
                    goto LAB_00115d89;
                  }
                  pcVar11 = "MUST";
                  pcVar15 = "inadequate";
                  pcVar12 = "MAY";
                  pcVar10 = "true";
                  if (uVar6 != 2) goto LAB_00115cd1;
                  goto LAB_00115cd8;
                }
                RHS_08.Length = 0x15;
                RHS_08.Data = "EXPECTEDFAIL_MAYALIAS";
                bVar4 = llvm::StringRef::equals(&local_3e0,RHS_08);
                if (bVar4) {
                  pcVar11 = "EXPECTEDFAIL_MAY";
                  if ((uVar6 & 0xfffffffd) != 1) {
                    pcVar10 = "unknown";
                    pcVar11 = "EXPECTEDFAIL_MAY";
                    goto LAB_00115c18;
                  }
                }
                else {
                  RHS_09.Length = 0x14;
                  RHS_09.Data = "EXPECTEDFAIL_NOALIAS";
                  bVar4 = llvm::StringRef::equals(&local_3e0,RHS_09);
                  if (!bVar4) goto LAB_00115ce6;
                  pcVar11 = "EXPECTEDFAIL_NO";
                  pcVar15 = "false";
                  pcVar12 = "NO";
                  if (uVar6 == 1) goto LAB_00115cd8;
                }
                pcVar15 = "true";
                if (uVar6 == 1) {
LAB_00115d89:
                  pcVar12 = "NO";
                  goto LAB_00115cd8;
                }
                pcVar10 = pcVar15;
                if (uVar6 == 3) goto LAB_00115cd1;
                goto LAB_00115c83;
              }
LAB_00115c4d:
              pcVar11 = "MAY";
              pcVar15 = "false";
              pcVar12 = "NO";
              if (uVar6 != 1) {
                pcVar10 = "toomuch";
                pcVar11 = "MAY";
                pcVar15 = "true";
                goto LAB_00115c7d;
              }
            }
LAB_00115cd8:
            printf("  pta %s %s ex %s\n",pcVar15,pcVar12,pcVar11);
          }
        }
      }
LAB_00115ce6:
      puVar16 = puVar16 + 1;
    }
    dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis(&PTA);
    iVar13 = 0;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::LLVMContext::~LLVMContext(&context);
  SlicerOptions::~SlicerOptions(&options);
  return iVar13;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-pta-ben", context, options);
    if (!M)
        return 1;

    TimeMeasure tm;
    auto &opts = options.dgOptions.PTAOptions;

    DGLLVMPointerAnalysis PTA(M.get(), opts);

    tm.start();

    PTA.run();

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    evalPTA(&PTA);

    return 0;
}